

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateWrapperFieldGetterDocComment
               (Printer *printer,FieldDescriptor *field)

{
  Descriptor *this;
  FieldDescriptor *this_00;
  undefined1 is_descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string local_80;
  string local_60;
  string local_40;
  
  this = FieldDescriptor::message_type(field);
  std::__cxx11::string::string((string *)&local_80,"value",(allocator *)&local_60);
  this_00 = Descriptor::FindFieldByName(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  io::Printer::Print<>(printer,"/**\n");
  UnderscoresToCamelCase(&local_80,*(string **)field,true);
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer," * Returns the unboxed value from <code>get^camel_name^()</code>\n\n",
             (char (*) [11])"camel_name",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  FieldDescriptor::DebugString_abi_cxx11_(&local_40,field);
  FirstLineOf(&local_60,&local_40);
  EscapePhpdoc(&local_80,&local_60);
  args_1 = &local_80;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * Generated from protobuf field <code>^def^</code>\n",(char (*) [4])0x394bb8,
             args_1);
  is_descriptor = SUB81(args_1,0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  PhpGetterTypeName_abi_cxx11_(&local_80,(php *)this_00,(FieldDescriptor *)0x0,(bool)is_descriptor);
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer," * @return ^php_type^|null\n",(char (*) [9])"php_type",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  io::Printer::Print<>(printer," */\n");
  return;
}

Assistant:

void GenerateWrapperFieldGetterDocComment(io::Printer* printer, const FieldDescriptor* field) {
  // Generate a doc comment for the special getXXXValue methods that are
  // generated for wrapper types.
  const FieldDescriptor* primitiveField = field->message_type()->FindFieldByName("value");
  printer->Print("/**\n");
  printer->Print(
      " * Returns the unboxed value from <code>get^camel_name^()</code>\n\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  GenerateDocCommentBody(printer, field);
  printer->Print(
    " * Generated from protobuf field <code>^def^</code>\n",
    "def", EscapePhpdoc(FirstLineOf(field->DebugString())));
  printer->Print(" * @return ^php_type^|null\n",
        "php_type", PhpGetterTypeName(primitiveField, false));
  printer->Print(" */\n");
}